

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O1

Error __thiscall
asmjit::RACFGBuilderT<asmjit::x86::RACFGBuilder>::run
          (RACFGBuilderT<asmjit::x86::RACFGBuilder> *this)

{
  RABlock **item;
  uint32_t *puVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  FuncNode *pFVar5;
  RABlock *pRVar6;
  BaseNode *pBVar7;
  BaseRAPass *pBVar8;
  Error EVar9;
  Error EVar10;
  Error EVar11;
  RABlock *pRVar12;
  undefined8 extraout_RAX;
  byte bVar13;
  uint uVar14;
  Error EVar15;
  ulong uVar16;
  ulong uVar17;
  RATiedReg *pRVar18;
  InvokeNode *initialNode;
  long lVar19;
  char cVar20;
  InvokeNode *pIVar21;
  bool bVar22;
  bool bVar23;
  char cVar24;
  float in_XMM0_Da;
  uint32_t controlType;
  LabelNode *labelNode;
  ZoneVector<asmjit::RABlock_*> blocksWithUnknownJumps;
  RAInstBuilder ib;
  uint32_t local_ca4;
  Error local_ca0;
  undefined4 uStack_c9c;
  uint64_t local_c98;
  long local_c90;
  long local_c88;
  RABlock *local_c80;
  ZoneVector<asmjit::RABlock_*> local_c78;
  RAInstBuilder local_c68;
  
  if (this->_logger != (Logger *)0x0) {
    Logger::logf(this->_logger,in_XMM0_Da);
  }
  EVar9 = prepare(this);
  if (EVar9 == 0) {
    if (this->_logger != (Logger *)0x0) {
      _logNode(this,(BaseNode *)this->_funcNode,2,(char *)0x0);
    }
    if (this->_logger != (Logger *)0x0) {
      _logBlock(this,this->_curBlock,2);
    }
    pFVar5 = this->_funcNode;
    pIVar21 = (InvokeNode *)
              ((anon_union_16_2_06f92970_for_BaseNode_0 *)&pFVar5->super_LabelNode)->_links[1];
    if (pIVar21 == (InvokeNode *)0x0) {
LAB_001387f7:
      EVar9 = 3;
    }
    else {
      item = &this->_curBlock;
      local_c80 = this->_curBlock;
      local_c80->_first = (BaseNode *)pFVar5;
      local_c80->_last = (BaseNode *)pFVar5;
      local_c68._cur = local_c68._tiedRegs;
      local_c68._clobbered._masks[0] = 0;
      local_c68._clobbered._masks[1] = 0;
      local_c68._clobbered._masks[2] = 0;
      local_c68._clobbered._masks[3] = 0;
      local_c68._used._masks[0] = 0;
      local_c68._used._masks[1] = 0;
      local_c68._used._masks[2] = 0;
      local_c68._used._masks[3] = 0;
      local_c68._aggregatedFlags = 0;
      local_c68._forbiddenFlags = 0;
      local_c68._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
      local_c68._stats._packed = 0;
      local_c78.super_ZoneVectorBase._data = (void *)0x0;
      local_c78.super_ZoneVectorBase._size = 0;
      local_c78.super_ZoneVectorBase._capacity = 0;
      EVar10 = EVar9;
      do {
        uVar3 = (pIVar21->super_InstNode).super_BaseNode._position;
        if (1 < uVar3 + 1) {
LAB_001387d5:
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O1/_deps/asmjit-src/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                     ,0x6f,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = (InvokeNode *)(pIVar21->super_InstNode).super_BaseNode.field_0._links[1];
        EVar11 = EVar9;
        if (((pIVar21->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) != 0) {
          if (*item == (RABlock *)0x0) {
            removeNode(this,(BaseNode *)pIVar21);
            cVar24 = '\x05';
            pIVar21 = initialNode;
            goto LAB_0013827c;
          }
          this->_hasCode = true;
          uVar2 = (pIVar21->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if ((byte)(uVar2 - 0x11) < 2) {
            if (uVar3 == 0xffffffff) {
              (pIVar21->super_InstNode).super_BaseNode._position = 0;
            }
            else {
              pBVar7 = (pIVar21->super_InstNode).super_BaseNode.field_0.field_0._prev;
              if (uVar2 == '\x12') {
                EVar10 = x86::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,pIVar21);
              }
              else {
                EVar10 = x86::RACFGBuilder::onBeforeRet((RACFGBuilder *)this,(FuncRetNode *)pIVar21)
                ;
              }
              if (EVar10 == 0) {
                if (pBVar7 != (pIVar21->super_InstNode).super_BaseNode.field_0.field_0._prev) {
                  if ((InvokeNode *)(*item)->_first == pIVar21) {
                    (*item)->_first = (pBVar7->field_0).field_0._next;
                  }
                  (pIVar21->super_InstNode).super_BaseNode._position = 0xffffffff;
                  pIVar21 = (InvokeNode *)(pBVar7->field_0)._links[1];
                  if ((*(byte *)((long)&pIVar21->super_InstNode + 0x11) & 0x20) == 0)
                  goto LAB_001387f2;
                }
                initialNode = (InvokeNode *)
                              ((anon_union_16_2_06f92970_for_BaseNode_0 *)&pIVar21->super_InstNode)
                              ->_links[1];
                bVar23 = true;
                EVar10 = EVar9;
              }
              else {
                bVar23 = false;
              }
              cVar24 = '\x01';
              EVar11 = EVar10;
              if (!bVar23) goto LAB_0013827c;
            }
          }
          if (this->_logger != (Logger *)0x0) {
            _logNode(this,(BaseNode *)pIVar21,4,(char *)0x0);
          }
          local_ca4 = 0;
          local_c68._aggregatedFlags = 0;
          local_c68._forbiddenFlags = 0;
          local_c68._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          local_c68._stats._packed = 0;
          local_c68._used._masks[0] = 0;
          local_c68._used._masks[1] = 0;
          local_c68._used._masks[2] = 0;
          local_c68._used._masks[3] = 0;
          local_c68._clobbered._masks[0] = 0;
          local_c68._clobbered._masks[1] = 0;
          local_c68._clobbered._masks[2] = 0;
          local_c68._clobbered._masks[3] = 0;
          local_c68._cur = local_c68._tiedRegs;
          EVar9 = x86::RACFGBuilder::onInst
                            ((RACFGBuilder *)this,&pIVar21->super_InstNode,&local_ca4,&local_c68);
          cVar20 = '\x01';
          cVar24 = cVar20;
          if ((EVar9 == 0) &&
             (((pIVar21->super_InstNode).super_BaseNode.field_1._any._nodeType != '\x12' ||
              (EVar9 = x86::RACFGBuilder::onInvoke((RACFGBuilder *)this,pIVar21,&local_c68),
              EVar9 == 0)))) {
            if ((pIVar21->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x11') {
              EVar9 = x86::RACFGBuilder::onRet
                                ((RACFGBuilder *)this,(FuncRetNode *)pIVar21,&local_c68);
              if (EVar9 != 0) goto LAB_0013819e;
              local_ca4 = 4;
            }
            if ((local_ca4 == 1) && (local_c68._tiedRegs != local_c68._cur)) {
              pBVar8 = this->_pass;
              pRVar12 = this->_curBlock;
              pRVar18 = local_c68._tiedRegs;
              uVar16 = 0;
              do {
                if ((pBVar8->_workRegs).super_ZoneVectorBase._size <= pRVar18->_workId) {
                  run();
                  goto LAB_001387d5;
                }
                uVar17 = uVar16;
                if ((*(byte *)(*(long *)((long)(pBVar8->_workRegs).super_ZoneVectorBase._data +
                                        (ulong)pRVar18->_workId * 8) + 0x21) & 0xf) == 0) {
                  bVar13 = (pRVar18->field_5).field_0._useId;
                  if (bVar13 == 0xff) {
                    uVar17 = (ulong)((int)uVar16 + 1);
                    bVar13 = pBVar8->_scratchRegIndexes[uVar16];
                    (pRVar18->field_5).field_0._useId = bVar13;
                  }
                  puVar1 = &pRVar12->_exitScratchGpRegs;
                  *puVar1 = *puVar1 | 1 << (bVar13 & 0x1f);
                }
                pRVar18 = pRVar18 + 1;
                uVar16 = uVar17;
              } while (pRVar18 != local_c68._cur);
            }
            EVar9 = BaseRAPass::assignRAInst
                              (this->_pass,(BaseNode *)pIVar21,this->_curBlock,&local_c68);
            uVar3 = local_ca4;
            if (EVar9 == 0) {
              uVar14 = (this->_blockRegStats)._packed | local_c68._stats._packed;
              (this->_blockRegStats)._packed = uVar14;
              if (local_ca4 != 0) {
                if (local_ca4 < 3) {
                  pRVar12 = *item;
                  pRVar12->_last = (BaseNode *)pIVar21;
                  uVar4 = pRVar12->_flags;
                  pRVar12->_flags = uVar4 | 0x101;
                  (pRVar12->_regsStats)._packed = (pRVar12->_regsStats)._packed | uVar14;
                  if (((pIVar21->super_InstNode)._baseInst._options & 2) == 0) {
                    bVar13 = (pIVar21->super_InstNode).super_BaseNode.field_1._any._reserved0;
                    if (bVar13 == 0) {
                      cVar24 = '\x01';
                      EVar10 = 3;
                    }
                    else {
                      uVar14 = bVar13 - 1;
                      if (((pIVar21->super_InstNode)._opArray[uVar14]._signature & 7) == 4) {
                        EVar9 = BaseBuilder::labelNodeOf
                                          (&this->_cc->super_BaseBuilder,(LabelNode **)&local_ca0,
                                           (pIVar21->super_InstNode)._opArray[uVar14]._baseId);
                        if (EVar9 == 0) {
                          bVar23 = false;
                          pRVar12 = BaseRAPass::newBlockOrExistingAt
                                              (this->_pass,
                                               (LabelNode *)CONCAT44(uStack_c9c,local_ca0),
                                               (BaseNode **)0x0);
                          if (pRVar12 == (RABlock *)0x0) {
                            EVar9 = 1;
                          }
                          else {
                            *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 4;
                            EVar11 = RABlock::appendSuccessor(*item,pRVar12);
                            bVar23 = EVar11 == 0;
                            EVar9 = EVar10;
                            if (!bVar23) {
                              EVar9 = EVar11;
                            }
                          }
                        }
                        else {
                          bVar23 = false;
                        }
                        cVar24 = '\x01';
                        EVar10 = EVar9;
                        if (bVar23) {
LAB_001385cb:
                          cVar24 = '\0';
                          EVar10 = EVar9;
                        }
                      }
                      else {
                        pRVar12->_flags = uVar4 | 0x501;
                        if ((pIVar21->super_InstNode).super_BaseNode.field_1._any._nodeType ==
                            '\x0f') {
                          lVar19._0_1_ = (pIVar21->_funcDetail)._callConv._id;
                          lVar19._1_1_ = (pIVar21->_funcDetail)._callConv._arch;
                          lVar19._2_1_ = (pIVar21->_funcDetail)._callConv._strategy;
                          lVar19._3_1_ = (pIVar21->_funcDetail)._callConv._redZoneSize;
                          lVar19._4_1_ = (pIVar21->_funcDetail)._callConv._spillZoneSize;
                          lVar19._5_1_ = (pIVar21->_funcDetail)._callConv._naturalStackAlignment;
                          lVar19._6_2_ = (pIVar21->_funcDetail)._callConv._flags;
                        }
                        else {
                          lVar19 = 0;
                        }
                        pBVar8 = this->_pass;
                        if (lVar19 == 0) {
                          EVar9 = ZoneVector<asmjit::RABlock_*>::append
                                            (&local_c78,&pBVar8->_allocator,item);
                          cVar24 = '\x01';
                          if (EVar9 == 0) goto LAB_001385c5;
                        }
                        else {
                          local_c98 = pBVar8->_lastTimestamp + 1;
                          pBVar8->_lastTimestamp = local_c98;
                          bVar23 = (ulong)*(uint *)(lVar19 + 0x18) == 0;
                          if (!bVar23) {
                            local_c88 = *(long *)(lVar19 + 0x10);
                            local_c90 = (ulong)*(uint *)(lVar19 + 0x18) << 2;
                            lVar19 = 0;
                            do {
                              EVar9 = BaseBuilder::labelNodeOf
                                                (&this->_cc->super_BaseBuilder,
                                                 (LabelNode **)&local_ca0,
                                                 *(uint32_t *)(local_c88 + lVar19));
                              if (EVar9 == 0) {
                                pRVar12 = BaseRAPass::newBlockOrExistingAt
                                                    (this->_pass,
                                                     (LabelNode *)CONCAT44(uStack_c9c,local_ca0),
                                                     (BaseNode **)0x0);
                                if (pRVar12 == (RABlock *)0x0) {
                                  EVar9 = 1;
                                  goto LAB_001384a7;
                                }
                                bVar22 = true;
                                if (pRVar12->_timestamp != local_c98) {
                                  pRVar12->_timestamp = local_c98;
                                  *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 4;
                                  EVar9 = RABlock::appendSuccessor(*item,pRVar12);
                                  bVar22 = EVar9 == 0;
                                  if (!bVar22) {
                                    EVar10 = EVar9;
                                  }
                                }
                              }
                              else {
LAB_001384a7:
                                bVar22 = false;
                                EVar10 = EVar9;
                              }
                              if (!bVar22) {
                                cVar24 = '\x01';
                                goto LAB_001385a0;
                              }
                              lVar19 = lVar19 + 4;
                              bVar23 = local_c90 == lVar19;
                            } while (!bVar23);
                          }
                          cVar24 = '\x1c';
LAB_001385a0:
                          EVar9 = EVar10;
                          if (bVar23) {
                            EVar10 = shareAssignmentAcrossSuccessors(this,this->_curBlock);
                            cVar24 = EVar10 != 0;
                            if ((bool)cVar24) {
                              EVar9 = EVar10;
                            }
                          }
                          EVar10 = EVar9;
                          if (cVar24 == '\0') {
LAB_001385c5:
                            EVar9 = EVar10;
                            cVar24 = '\0';
                          }
                        }
                        EVar10 = EVar9;
                        if (cVar24 == '\0') goto LAB_001385cb;
                      }
                    }
                    EVar9 = EVar10;
                    if (cVar24 != '\0') goto LAB_0013819e;
                  }
                  if (uVar3 != 1) {
                    pIVar21 = initialNode;
                    if (initialNode == (InvokeNode *)0x0) {
                      EVar9 = 3;
                      cVar24 = cVar20;
                      goto LAB_0013819e;
                    }
                    if ((((anon_union_4_4_9308554c_for_BaseNode_2 *)
                         ((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode +
                         1))->_any)._nodeType == '\x03') {
                      pRVar12 = *(RABlock **)
                                 &((anon_union_16_2_06f92970_for_BaseNode_0 *)
                                  &initialNode->super_InstNode)[2].field_0;
                      if (pRVar12 == (RABlock *)0x0) {
                        pRVar12 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
                        if (pRVar12 == (RABlock *)0x0) goto LAB_00138769;
                        *(RABlock **)
                         &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)
                          [2].field_0 = pRVar12;
                      }
                    }
                    else {
                      pRVar12 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
                      if (pRVar12 == (RABlock *)0x0) {
LAB_00138769:
                        EVar9 = 1;
                        cVar24 = '\x01';
                        goto LAB_0013819e;
                      }
                    }
                    pRVar6 = *item;
                    puVar1 = &pRVar6->_flags;
                    *puVar1 = *puVar1 | 0x200;
                    EVar9 = RABlock::prependSuccessor(pRVar6,pRVar12);
                    cVar24 = cVar20;
                    if (EVar9 == 0) {
                      this->_curBlock = pRVar12;
                      this->_hasCode = false;
                      (this->_blockRegStats)._packed = 0;
                      if ((pRVar12->_flags & 1) == 0) {
                        EVar9 = BaseRAPass::addBlock(this->_pass,pRVar12);
                        if ((EVar9 == 0) &&
                           (EVar9 = EVar10, cVar24 = '\x05', this->_logger != (Logger *)0x0)) {
                          _logBlock(this,this->_curBlock,2);
                        }
                      }
                      else {
                        EVar9 = EVar10;
                        cVar24 = '\x04';
                      }
                    }
                    goto LAB_0013819e;
                  }
                  *item = (RABlock *)0x0;
                }
                if (uVar3 == 4) {
                  pRVar12 = this->_curBlock;
                  pRVar12->_last = (BaseNode *)pIVar21;
                  *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 1;
                  (pRVar12->_regsStats)._packed =
                       (pRVar12->_regsStats)._packed | (this->_blockRegStats)._packed;
                  EVar9 = RABlock::appendSuccessor(pRVar12,this->_retBlock);
                  cVar24 = cVar20;
                  if (EVar9 != 0) goto LAB_0013819e;
                  *item = (RABlock *)0x0;
                }
              }
              EVar9 = EVar10;
              cVar24 = '\0';
            }
          }
LAB_0013819e:
          EVar11 = EVar9;
          EVar10 = EVar9;
          if (cVar24 != '\0') goto LAB_0013827c;
          goto LAB_0013826d;
        }
        if ((pIVar21->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x03') {
          pRVar12 = *item;
          pRVar6 = (RABlock *)(pIVar21->super_InstNode).super_BaseNode._passData;
          if (pRVar12 != (RABlock *)0x0) {
            if (pRVar6 == (RABlock *)0x0) {
              if ((pRVar12 == local_c80 | this->_hasCode) == 1) {
                if ((InvokeNode *)pRVar12->_last == pIVar21) {
                  run();
                  __clang_call_terminate(extraout_RAX);
                }
                pRVar12->_last = (pIVar21->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar12->_flags = pRVar12->_flags | 0x201;
                (pRVar12->_regsStats)._packed =
                     (pRVar12->_regsStats)._packed | (this->_blockRegStats)._packed;
                pRVar12 = BaseRAPass::newBlock(this->_pass,(BaseNode *)pIVar21);
                cVar24 = '\x01';
                if (pRVar12 == (RABlock *)0x0) {
                  bVar23 = false;
                  EVar9 = 1;
                }
                else {
                  *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 4;
                  EVar10 = RABlock::appendSuccessor(*item,pRVar12);
                  if ((EVar10 == 0) &&
                     (EVar10 = BaseRAPass::addBlock(this->_pass,pRVar12), EVar10 == 0)) {
                    this->_curBlock = pRVar12;
                    this->_hasCode = false;
                    (this->_blockRegStats)._packed = 0;
                    bVar23 = true;
                  }
                  else {
                    bVar23 = false;
                    EVar9 = EVar10;
                  }
                }
                EVar11 = EVar9;
                EVar10 = EVar9;
                if (!bVar23) goto LAB_0013827c;
              }
              (pIVar21->super_InstNode).super_BaseNode._passData = *item;
              EVar15 = EVar10;
            }
            else {
              *(byte *)&pRVar6->_flags = (byte)pRVar6->_flags | 4;
              if (pRVar12 == pRVar6) {
                bVar23 = true;
                if (this->_hasCode == true) {
                  EVar10 = 3;
LAB_00137f23:
                  EVar9 = EVar10;
                  bVar23 = false;
                  EVar10 = EVar9;
                }
              }
              else {
                if ((InvokeNode *)pRVar12->_last == pIVar21) {
                  run();
LAB_001387f2:
                  run();
                  goto LAB_001387f7;
                }
                pRVar12->_last = (pIVar21->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar12->_flags = pRVar12->_flags | 0x201;
                (pRVar12->_regsStats)._packed =
                     (pRVar12->_regsStats)._packed | (this->_blockRegStats)._packed;
                EVar10 = RABlock::appendSuccessor(pRVar12,pRVar6);
                if ((EVar10 != 0) ||
                   (EVar10 = BaseRAPass::addBlock(this->_pass,pRVar6), EVar10 != 0))
                goto LAB_00137f23;
                this->_curBlock = pRVar6;
                this->_hasCode = false;
                (this->_blockRegStats)._packed = 0;
                bVar23 = true;
                EVar10 = EVar9;
              }
              cVar24 = '\x01';
              EVar11 = EVar9;
              EVar15 = EVar10;
              if (!bVar23) goto LAB_0013827c;
            }
LAB_00138224:
            pRVar12 = this->_curBlock;
            if (((pRVar12 != (RABlock *)0x0) && (pRVar12 != this->_lastLoggedBlock)) &&
               (this->_logger != (Logger *)0x0)) {
              _logBlock(this,pRVar12,2);
            }
            if (this->_logger != (Logger *)0x0) {
              _logNode(this,(BaseNode *)pIVar21,2,(char *)0x0);
            }
            EVar10 = EVar15;
            if ((pIVar21->super_InstNode)._baseInst._id == this->_exitLabelId) {
              pRVar12 = this->_curBlock;
              pRVar12->_last = (BaseNode *)pIVar21;
              *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 1;
              (pRVar12->_regsStats)._packed =
                   (pRVar12->_regsStats)._packed | (this->_blockRegStats)._packed;
              EVar10 = BaseRAPass::addExitBlock(this->_pass,pRVar12);
              cVar24 = '\x01';
              EVar11 = EVar10;
              if (EVar10 != 0) goto LAB_0013827c;
              *item = (RABlock *)0x0;
              EVar10 = EVar9;
            }
            goto LAB_0013826d;
          }
          *item = pRVar6;
          if (pRVar6 == (RABlock *)0x0) {
            pRVar12 = BaseRAPass::newBlock(this->_pass,(BaseNode *)pIVar21);
            this->_curBlock = pRVar12;
            if (pRVar12 != (RABlock *)0x0) {
              (pIVar21->super_InstNode).super_BaseNode._passData = pRVar12;
              goto LAB_001381ed;
            }
            cVar24 = '\x01';
            EVar11 = 1;
            EVar10 = 1;
          }
          else {
            cVar24 = '\x04';
            if ((pRVar6->_flags & 1) == 0) {
LAB_001381ed:
              pRVar12 = this->_curBlock;
              puVar1 = &pRVar12->_flags;
              *puVar1 = *puVar1 | 4;
              this->_hasCode = false;
              (this->_blockRegStats)._packed = 0;
              EVar10 = BaseRAPass::addBlock(this->_pass,pRVar12);
              cVar24 = '\x01';
              EVar11 = EVar10;
              EVar15 = EVar9;
              if (EVar10 == 0) goto LAB_00138224;
            }
          }
        }
        else {
          if (this->_logger != (Logger *)0x0) {
            _logNode(this,(BaseNode *)pIVar21,4,(char *)0x0);
          }
          uVar2 = (pIVar21->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (uVar2 == '\n') {
            if (pIVar21 == (InvokeNode *)this->_funcNode->_end) {
              cVar24 = '\x04';
              if (*item == (RABlock *)0x0) goto LAB_0013827c;
LAB_00137fc5:
              cVar24 = '\x01';
              EVar11 = 3;
              EVar10 = 3;
              goto LAB_0013827c;
            }
          }
          else if ((uVar2 == '\x10') && (pIVar21 != (InvokeNode *)this->_funcNode))
          goto LAB_00137fc5;
LAB_0013826d:
          cVar24 = '\0';
          pIVar21 = initialNode;
          EVar11 = EVar9;
          if (initialNode == (InvokeNode *)0x0) {
            EVar10 = 3;
            cVar24 = '\x01';
            EVar11 = 3;
          }
        }
LAB_0013827c:
        EVar9 = EVar11;
      } while ((cVar24 == '\0') || (cVar24 == '\x05'));
      if ((cVar24 == '\x04') &&
         (EVar9 = 3,
         this->_pass->_createdBlockCount == (this->_pass->_blocks).super_ZoneVectorBase._size)) {
        run();
        EVar9 = local_ca0;
      }
    }
  }
  return EVar9;
}

Assistant:

Error run() noexcept {
    log("[RAPass::BuildCFG]\n");
    ASMJIT_PROPAGATE(prepare());

    logNode(_funcNode, kRootIndentation);
    logBlock(_curBlock, kRootIndentation);

    RABlock* entryBlock = _curBlock;
    BaseNode* node = _funcNode->next();
    if (ASMJIT_UNLIKELY(!node))
      return DebugUtils::errored(kErrorInvalidState);

    _curBlock->setFirst(_funcNode);
    _curBlock->setLast(_funcNode);

    RAInstBuilder ib;
    ZoneVector<RABlock*> blocksWithUnknownJumps;

    for (;;) {
      BaseNode* next = node->next();
      ASMJIT_ASSERT(node->position() == 0 || node->position() == kNodePositionDidOnBefore);

      if (node->isInst()) {
        // Instruction | Jump | Invoke | Return
        // ------------------------------------

        // Handle `InstNode`, `InvokeNode`, and `FuncRetNode`. All of them
        // share the same interface that provides operands that have read/write
        // semantics.
        if (ASMJIT_UNLIKELY(!_curBlock)) {
          // Unreachable code has to be removed, we cannot allocate registers
          // in such code as we cannot do proper liveness analysis in such case.
          removeNode(node);
          node = next;
          continue;
        }

        _hasCode = true;

        if (node->isInvoke() || node->isFuncRet()) {
          if (node->position() != kNodePositionDidOnBefore) {
            // Call and Reg are complicated as they may insert some surrounding
            // code around them. The simplest approach is to get the previous
            // node, call the `onBefore()` handlers and then check whether
            // anything changed and restart if so. By restart we mean that the
            // current `node` would go back to the first possible inserted node
            // by `onBeforeInvoke()` or `onBeforeRet()`.
            BaseNode* prev = node->prev();

            if (node->type() == BaseNode::kNodeInvoke)
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeInvoke(node->as<InvokeNode>()));
            else
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeRet(node->as<FuncRetNode>()));

            if (prev != node->prev()) {
              // If this was the first node in the block and something was
              // inserted before it then we have to update the first block.
              if (_curBlock->first() == node)
                _curBlock->setFirst(prev->next());

              node->setPosition(kNodePositionDidOnBefore);
              node = prev->next();

              // `onBeforeInvoke()` and `onBeforeRet()` can only insert instructions.
              ASMJIT_ASSERT(node->isInst());
            }

            // Necessary if something was inserted after `node`, but nothing before.
            next = node->next();
          }
          else {
            // Change the position back to its original value.
            node->setPosition(0);
          }
        }

        InstNode* inst = node->as<InstNode>();
        logNode(inst, kCodeIndentation);

        uint32_t controlType = BaseInst::kControlNone;
        ib.reset();
        ASMJIT_PROPAGATE(static_cast<This*>(this)->onInst(inst, controlType, ib));

        if (node->isInvoke()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onInvoke(inst->as<InvokeNode>(), ib));
        }

        if (node->isFuncRet()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onRet(inst->as<FuncRetNode>(), ib));
          controlType = BaseInst::kControlReturn;
        }

        if (controlType == BaseInst::kControlJump) {
          uint32_t fixedRegCount = 0;
          for (RATiedReg& tiedReg : ib) {
            RAWorkReg* workReg = _pass->workRegById(tiedReg.workId());
            if (workReg->group() == BaseReg::kGroupGp) {
              uint32_t useId = tiedReg.useId();
              if (useId == BaseReg::kIdBad) {
                useId = _pass->_scratchRegIndexes[fixedRegCount++];
                tiedReg.setUseId(useId);
              }
              _curBlock->addExitScratchGpRegs(Support::bitMask<uint32_t>(useId));
            }
          }
        }

        ASMJIT_PROPAGATE(_pass->assignRAInst(inst, _curBlock, ib));
        _blockRegStats.combineWith(ib._stats);

        if (controlType != BaseInst::kControlNone) {
          // Support for conditional and unconditional jumps.
          if (controlType == BaseInst::kControlJump || controlType == BaseInst::kControlBranch) {
            _curBlock->setLast(node);
            _curBlock->addFlags(RABlock::kFlagHasTerminator);
            _curBlock->makeConstructed(_blockRegStats);

            if (!(inst->instOptions() & BaseInst::kOptionUnfollow)) {
              // Jmp/Jcc/Call/Loop/etc...
              uint32_t opCount = inst->opCount();
              const Operand* opArray = inst->operands();

              // Cannot jump anywhere without operands.
              if (ASMJIT_UNLIKELY(!opCount))
                return DebugUtils::errored(kErrorInvalidState);

              if (opArray[opCount - 1].isLabel()) {
                // Labels are easy for constructing the control flow.
                LabelNode* labelNode;
                ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, opArray[opCount - 1].as<Label>()));

                RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                if (ASMJIT_UNLIKELY(!targetBlock))
                  return DebugUtils::errored(kErrorOutOfMemory);

                targetBlock->makeTargetable();
                ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
              }
              else {
                // Not a label - could be jump with reg/mem operand, which
                // means that it can go anywhere. Such jumps must either be
                // annotated so the CFG can be properly constructed, otherwise
                // we assume the worst case - can jump to any basic block.
                JumpAnnotation* jumpAnnotation = nullptr;
                _curBlock->addFlags(RABlock::kFlagHasJumpTable);

                if (inst->type() == BaseNode::kNodeJump)
                  jumpAnnotation = inst->as<JumpNode>()->annotation();

                if (jumpAnnotation) {
                  uint64_t timestamp = _pass->nextTimestamp();
                  for (uint32_t id : jumpAnnotation->labelIds()) {
                    LabelNode* labelNode;
                    ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, id));

                    RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                    if (ASMJIT_UNLIKELY(!targetBlock))
                      return DebugUtils::errored(kErrorOutOfMemory);

                    // Prevents adding basic-block successors multiple times.
                    if (!targetBlock->hasTimestamp(timestamp)) {
                      targetBlock->setTimestamp(timestamp);
                      targetBlock->makeTargetable();
                      ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
                    }
                  }
                  ASMJIT_PROPAGATE(shareAssignmentAcrossSuccessors(_curBlock));
                }
                else {
                  ASMJIT_PROPAGATE(blocksWithUnknownJumps.append(_pass->allocator(), _curBlock));
                }
              }
            }

            if (controlType == BaseInst::kControlJump) {
              // Unconditional jump makes the code after the jump unreachable,
              // which will be removed instantly during the CFG construction;
              // as we cannot allocate registers for instructions that are not
              // part of any block. Of course we can leave these instructions
              // as they are, however, that would only postpone the problem as
              // assemblers can't encode instructions that use virtual registers.
              _curBlock = nullptr;
            }
            else {
              node = next;
              if (ASMJIT_UNLIKELY(!node))
                return DebugUtils::errored(kErrorInvalidState);

              RABlock* consecutiveBlock;
              if (node->type() == BaseNode::kNodeLabel) {
                if (node->hasPassData()) {
                  consecutiveBlock = node->passData<RABlock>();
                }
                else {
                  consecutiveBlock = _pass->newBlock(node);
                  if (ASMJIT_UNLIKELY(!consecutiveBlock))
                    return DebugUtils::errored(kErrorOutOfMemory);
                  node->setPassData<RABlock>(consecutiveBlock);
                }
              }
              else {
                consecutiveBlock = _pass->newBlock(node);
                if (ASMJIT_UNLIKELY(!consecutiveBlock))
                  return DebugUtils::errored(kErrorOutOfMemory);
              }

              _curBlock->addFlags(RABlock::kFlagHasConsecutive);
              ASMJIT_PROPAGATE(_curBlock->prependSuccessor(consecutiveBlock));

              _curBlock = consecutiveBlock;
              _hasCode = false;
              _blockRegStats.reset();

              if (_curBlock->isConstructed())
                break;
              ASMJIT_PROPAGATE(_pass->addBlock(consecutiveBlock));

              logBlock(_curBlock, kRootIndentation);
              continue;
            }
          }

          if (controlType == BaseInst::kControlReturn) {
            _curBlock->setLast(node);
            _curBlock->makeConstructed(_blockRegStats);
            ASMJIT_PROPAGATE(_curBlock->appendSuccessor(_retBlock));

            _curBlock = nullptr;
          }
        }
      }
      else if (node->type() == BaseNode::kNodeLabel) {
        // Label - Basic-Block Management
        // ------------------------------

        if (!_curBlock) {
          // If the current code is unreachable the label makes it reachable
          // again. We may remove the whole block in the future if it's not
          // referenced though.
          _curBlock = node->passData<RABlock>();

          if (_curBlock) {
            // If the label has a block assigned we can either continue with
            // it or skip it if the block has been constructed already.
            if (_curBlock->isConstructed())
              break;
          }
          else {
            // No block assigned - create a new one and assign it.
            _curBlock = _pass->newBlock(node);
            if (ASMJIT_UNLIKELY(!_curBlock))
              return DebugUtils::errored(kErrorOutOfMemory);
            node->setPassData<RABlock>(_curBlock);
          }

          _curBlock->makeTargetable();
          _hasCode = false;
          _blockRegStats.reset();
          ASMJIT_PROPAGATE(_pass->addBlock(_curBlock));
        }
        else {
          if (node->hasPassData()) {
            RABlock* consecutive = node->passData<RABlock>();
            consecutive->makeTargetable();

            if (_curBlock == consecutive) {
              // The label currently processed is part of the current block. This
              // is only possible for multiple labels that are right next to each
              // other or labels that are separated by non-code nodes like directives
              // and comments.
              if (ASMJIT_UNLIKELY(_hasCode))
                return DebugUtils::errored(kErrorInvalidState);
            }
            else {
              // Label makes the current block constructed. There is a chance that the
              // Label is not used, but we don't know that at this point. In the worst
              // case there would be two blocks next to each other, it's just fine.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlock::kFlagHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }
          }
          else {
            // First time we see this label.
            if (_hasCode || _curBlock == entryBlock) {
              // Cannot continue the current block if it already contains some
              // code or it's a block entry. We need to create a new block and
              // make it a successor.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlock::kFlagHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              RABlock* consecutive = _pass->newBlock(node);
              if (ASMJIT_UNLIKELY(!consecutive))
                return DebugUtils::errored(kErrorOutOfMemory);
              consecutive->makeTargetable();

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }

            node->setPassData<RABlock>(_curBlock);
          }
        }

        if (_curBlock && _curBlock != _lastLoggedBlock)
          logBlock(_curBlock, kRootIndentation);
        logNode(node, kRootIndentation);

        // Unlikely: Assume that the exit label is reached only once per function.
        if (ASMJIT_UNLIKELY(node->as<LabelNode>()->labelId() == _exitLabelId)) {
          _curBlock->setLast(node);
          _curBlock->makeConstructed(_blockRegStats);
          ASMJIT_PROPAGATE(_pass->addExitBlock(_curBlock));

          _curBlock = nullptr;
        }
      }
      else {
        // Other Nodes | Function Exit
        // ---------------------------

        logNode(node, kCodeIndentation);

        if (node->type() == BaseNode::kNodeSentinel) {
          if (node == _funcNode->endNode()) {
            // Make sure we didn't flow here if this is the end of the function sentinel.
            if (ASMJIT_UNLIKELY(_curBlock))
              return DebugUtils::errored(kErrorInvalidState);
            break;
          }
        }
        else if (node->type() == BaseNode::kNodeFunc) {
          // RAPass can only compile a single function at a time. If we
          // encountered a function it must be the current one, bail if not.
          if (ASMJIT_UNLIKELY(node != _funcNode))
            return DebugUtils::errored(kErrorInvalidState);
          // PASS if this is the first node.
        }
        else {
          // PASS if this is a non-interesting or unknown node.
        }
      }

      // Advance to the next node.
      node = next;

      // NOTE: We cannot encounter a NULL node, because every function must be
      // terminated by a sentinel (`stop`) node. If we encountered a NULL node it
      // means that something went wrong and this node list is corrupted; bail in
      // such case.
      if (ASMJIT_UNLIKELY(!node))
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (_pass->hasDanglingBlocks())
      return DebugUtils::errored(kErrorInvalidState);

    for (RABlock* block : blocksWithUnknownJumps)
      handleBlockWithUnknownJump(block);

    return _pass->initSharedAssignments(_sharedAssignmentsMap);
  }